

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryCommitReplacement
          (DiskHandle *this,StringPtr toPath,int fromDirFd,StringPtr fromPath,WriteMode mode,
          int *errorReason)

{
  StringPtr path;
  StringPtr toPath_00;
  StringPtr fromPath_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Fault *this_00;
  char *__old;
  char *pcVar6;
  char *pcVar7;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr toPath_local;
  StringPtr fromPath_local;
  String away;
  Fault f_4;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_120;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> local_108;
  NullableValue<kj::String> local_f8;
  Path toPathParsed;
  Fault f;
  uint local_a8;
  
  pcVar7 = (char *)fromPath.content.size_;
  __old = fromPath.content.ptr;
  toPath_local.content.size_ = toPath.content.size_;
  pcVar6 = toPath.content.ptr;
  toPath_local.content.ptr = pcVar6;
  fromPath_local.content.ptr = __old;
  fromPath_local.content.size_ = (size_t)pcVar7;
  if ((mode & CREATE) == 0) {
    if ((mode & MODIFY) == 0) {
      return false;
    }
LAB_00285a3b:
    do {
      uVar5 = (ulong)(uint)(this->fd).fd;
      lVar4 = syscall(0x13c,(ulong)(uint)fromDirFd,__old,uVar5,pcVar6,2);
      if (-1 < lVar4) goto LAB_00285aec;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 == 0) {
LAB_00285aec:
      path_00.content.size_ = uVar5;
      path_00.content.ptr = pcVar7;
      rmrf((anon_unknown_8 *)(ulong)(uint)fromDirFd,(int)fromPath.content.ptr,path_00);
      return true;
    }
    if (iVar2 == 0x26) {
      if ((mode & CREATE) != 0) {
        do {
          iVar2 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
          if (-1 < iVar2) goto LAB_00285bb9;
          iVar2 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar2 == -1);
        if (iVar2 == 0) {
LAB_00285bb9:
          path.content.size_ = toPath_local.content.size_;
          path.content.ptr = toPath_local.content.ptr;
          Path::parse(&toPathParsed,path);
          away.content.disposer = (ArrayDisposer *)0x0;
          away.content.ptr = (char *)0x0;
          away.content.size_ = 0;
          local_108.ptr = (Iface *)operator_new(0x18);
          (local_108.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0030e7a0;
          local_108.ptr[1]._vptr_Iface = (_func_int **)&f;
          local_108.ptr[2]._vptr_Iface = (_func_int **)this;
          local_108.disposer =
               (Disposer *)
               &kj::_::
                HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::{lambda(kj::StringPtr)#1}>>
                ::instance;
          createNamedTemporary
                    ((Maybe<kj::String> *)&local_f8,this,(PathPtr)toPathParsed.parts._0_16_,CREATE,
                     (Function<int_(kj::StringPtr)> *)&local_108);
          f_4.exception._0_1_ = local_f8.isSet;
          if (local_f8.isSet == true) {
            local_120.value.content.ptr = local_f8.field_1.value.content.ptr;
            local_120.value.content.size_ = local_f8.field_1.value.content.size_;
            local_120.value.content.disposer = local_f8.field_1.value.content.disposer;
            local_f8.field_1.value.content.ptr = (char *)0x0;
            local_f8.field_1.value.content.size_ = 0;
          }
          kj::_::NullableValue<kj::String>::~NullableValue(&local_f8);
          Own<kj::Function<int_(kj::StringPtr)>::Iface>::dispose(&local_108);
          if ((char)f_4.exception == '\x01') {
            Array<char>::operator=(&away.content,&local_120.value.content);
            kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f_4);
            do {
              pcVar6 = "";
              if (away.content.size_ != 0) {
                pcVar6 = away.content.ptr;
              }
              iVar2 = (this->fd).fd;
              iVar2 = renameat(iVar2,toPath_local.content.ptr,iVar2,pcVar6);
              if (-1 < iVar2) goto LAB_00285ccc;
              iVar2 = kj::_::Debug::getOsErrorNumber(false);
            } while (iVar2 == -1);
            if (iVar2 == 0) {
LAB_00285ccc:
              do {
                pcVar6 = toPath_local.content.ptr;
                iVar2 = renameat(fromDirFd,fromPath_local.content.ptr,(this->fd).fd,
                                 toPath_local.content.ptr);
                if (-1 < iVar2) goto LAB_00285cfa;
                iVar2 = kj::_::Debug::getOsErrorNumber(false);
              } while (iVar2 == -1);
              if (iVar2 == 0) {
LAB_00285cfa:
                if (away.content.size_ == 0) {
                  iVar2 = 0x2b02ed;
                }
                else {
                  iVar2 = (int)away.content.ptr;
                }
                path_01.content.ptr = (char *)(away.content.size_ + (away.content.size_ == 0));
                bVar1 = true;
                path_01.content.size_ = (size_t)pcVar6;
                rmrf((anon_unknown_8 *)(ulong)(uint)(this->fd).fd,iVar2,path_01);
                goto LAB_00285f7a;
              }
              do {
                pcVar6 = "";
                if (away.content.size_ != 0) {
                  pcVar6 = away.content.ptr;
                }
                iVar3 = (this->fd).fd;
                iVar3 = renameat(iVar3,pcVar6,iVar3,toPath_local.content.ptr);
              } while ((iVar3 < 0) && (iVar3 = kj::_::Debug::getOsErrorNumber(false), iVar3 == -1));
              if (errorReason == (int *)0x0) {
                kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                          (&f_4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                           ,0x4aa,iVar2,"rename(fromPath, toPath)","fromPath, toPath",
                           &fromPath_local,&toPath_local);
                kj::_::Debug::Fault::~Fault(&f_4);
              }
              else {
                *errorReason = iVar2;
              }
            }
            else {
              kj::_::Debug::Fault::Fault
                        (&f_4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                         ,0x49a,iVar2,"renameat(fd, toPath.cStr(), fd, away.cStr())","");
              pcVar6 = "";
              if (away.content.size_ != 0) {
                pcVar6 = away.content.ptr;
              }
              unlinkat((this->fd).fd,pcVar6,(uint)((local_a8 & 0xf000) == 0x4000) << 9);
              kj::_::Debug::Fault::~Fault(&f_4);
            }
          }
          else {
            kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f_4);
          }
          bVar1 = false;
LAB_00285f7a:
          Array<char>::~Array(&away.content);
          Array<kj::String>::~Array(&toPathParsed.parts);
          return bVar1;
        }
        this_00 = &f_4;
        kj::_::Debug::Fault::Fault
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x47c,iVar2,"fstatat(fd, toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)","");
        goto LAB_00285e15;
      }
      do {
        iVar2 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
        if (-1 < iVar2) goto LAB_00285d7d;
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 == 0) {
LAB_00285d7d:
        toPath_00.content.size_ = toPath_local.content.size_;
        toPath_00.content.ptr = toPath_local.content.ptr;
        fromPath_00.content.size_ = fromPath_local.content.size_;
        fromPath_00.content.ptr = fromPath_local.content.ptr;
        bVar1 = tryCommitReplacement(this,toPath_00,fromDirFd,fromPath_00,MODIFY|CREATE,errorReason)
        ;
        return bVar1;
      }
      if (iVar2 == 2) {
        return false;
      }
      if (iVar2 == 0x14) {
        return false;
      }
      iVar3 = 0x4cb;
LAB_00285b80:
      this_00 = &f_4;
      kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                (&f_4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,iVar3,iVar2,"fstatat(fd, toPath)","toPath",&toPath_local);
      goto LAB_00285e15;
    }
    if (iVar2 == 2) {
      if ((mode & CREATE) == 0) {
        return false;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[120],kj::StringPtr&,kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,1099,FAILED,(char *)0x0,
                 "\"rename(tmp, path) claimed path exists but \" \"renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?\", fromPath, toPath"
                 ,(char (*) [120])
                  "rename(tmp, path) claimed path exists but renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?"
                 ,&fromPath_local,&toPath_local);
      kj::_::Debug::Fault::~Fault(&f);
      return false;
    }
    if (errorReason != (int *)0x0) {
LAB_00285d76:
      *errorReason = iVar2;
      return false;
    }
    pcVar6 = "renameat2(fromPath, toPath, EXCHANGE)";
    iVar3 = 0x452;
  }
  else if ((mode & MODIFY) == 0) {
    do {
      lVar4 = syscall(0x13c,(ulong)(uint)fromDirFd,__old,(ulong)(uint)(this->fd).fd,pcVar6,1);
      if (-1 < lVar4) {
        return true;
      }
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 == 0) {
      return true;
    }
    if (iVar2 == 0x11) {
      return false;
    }
    if (iVar2 == 0x26) {
      if ((mode & CREATE) == 0) {
        return false;
      }
      do {
        iVar2 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
        if (-1 < iVar2) {
          return false;
        }
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 == 0) {
        return false;
      }
      if ((iVar2 == 2) || (iVar2 == 0x14)) goto LAB_00285d7d;
      iVar3 = 0x4c0;
      goto LAB_00285b80;
    }
    if (errorReason != (int *)0x0) goto LAB_00285d76;
    pcVar6 = "renameat2(fromPath, toPath, NOREPLACE)";
    iVar3 = 0x467;
  }
  else {
    do {
      iVar2 = renameat(fromDirFd,__old,(this->fd).fd,pcVar6);
      if (-1 < iVar2) {
        return true;
      }
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
      uVar5 = (ulong)(iVar2 + 1U);
      if (0x28 < iVar2 + 1U) goto LAB_00285d55;
    } while (uVar5 == 0);
    if ((0x10000640000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00285a3b;
    if (uVar5 == 1) {
      return true;
    }
LAB_00285d55:
    if (errorReason != (int *)0x0) {
      *errorReason = iVar2;
      return false;
    }
    pcVar6 = "rename(fromPath, toPath)";
    iVar3 = 0x42e;
  }
  this_00 = &f;
  kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,iVar3,iVar2,pcVar6,"fromPath, toPath",&fromPath_local,&toPath_local);
LAB_00285e15:
  kj::_::Debug::Fault::~Fault(this_00);
  return false;
}

Assistant:

bool tryCommitReplacement(StringPtr toPath, int fromDirFd, StringPtr fromPath, WriteMode mode,
                            int* errorReason = nullptr) const {
    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // Always clobber. Try it.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr())) {
        case EISDIR:
        case ENOTDIR:
        case ENOTEMPTY:
        case EEXIST:
          // Failed because target exists and due to the various weird quirks of rename(), it
          // can't remove it for us. On Linux we can try an exchange instead. On others we have
          // to move the target out of the way.
          break;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) { return false; }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }

#if __linux__ && defined(RENAME_EXCHANGE)
    // Try to use Linux's renameat2() to atomically check preconditions and apply.

    if (has(mode, WriteMode::MODIFY)) {
      // Use an exchange to implement modification.
      //
      // We reach this branch when performing a MODIFY-only, or when performing a CREATE | MODIFY
      // in which we determined above that there's a node of a different type blocking the
      // exchange.

      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_EXCHANGE)) {
        case ENOSYS:
          break;  // fall back to traditional means
        case ENOENT:
          // Presumably because the target path doesn't exist.
          if (has(mode, WriteMode::CREATE)) {
            KJ_FAIL_ASSERT("rename(tmp, path) claimed path exists but "
                "renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?",
                fromPath, toPath) { return false; }
          } else {
            // Assume target doesn't exist.
            return false;
          }
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, EXCHANGE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        // Successful swap! Delete swapped-out content.
        rmrf(fromDirFd, fromPath);
        return true;
      }
    } else if (has(mode, WriteMode::CREATE)) {
      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_NOREPLACE)) {
        case ENOSYS:
          break;  // fall back to traditional means
        case EEXIST:
          return false;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, NOREPLACE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }
#endif

    // We're unable to do what we wanted atomically. :(

    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // We failed to atomically delete the target previously. So now we need to do two calls in
      // rapid succession to move the old file away then move the new one into place.

      // Find out what kind of file exists at the target path.
      struct stat stats;
      KJ_SYSCALL(fstatat(fd, toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) { return false; }

      // Create a temporary location to move the existing object to. Note that rename() allows a
      // non-directory to replace a non-directory, and allows a directory to replace an empty
      // directory. So we have to create the right type.
      Path toPathParsed = Path::parse(toPath);
      String away;
      KJ_IF_MAYBE(awayPath, createNamedTemporary(toPathParsed, WriteMode::CREATE,
          [&](StringPtr candidatePath) {
        if (S_ISDIR(stats.st_mode)) {
          return mkdirat(fd, candidatePath.cStr(), 0700);
        } else {
#if __APPLE__
          // No mknodat() on OSX, gotta open() a file, ugh.
          int newFd = openat(fd, candidatePath.cStr(),
                             O_RDWR | O_CREAT | O_EXCL | MAYBE_O_CLOEXEC, 0700);
          if (newFd >= 0) close(newFd);
          return newFd;
#else
          return mknodat(fd, candidatePath.cStr(), S_IFREG | 0600, dev_t());
#endif
        }
      })) {
        away = kj::mv(*awayPath);
      } else {
        // Already threw.
        return false;
      }

      // OK, now move the target object to replace the thing we just created.
      KJ_SYSCALL(renameat(fd, toPath.cStr(), fd, away.cStr())) {
        // Something went wrong. Remove the thing we just created.
        unlinkat(fd, away.cStr(), S_ISDIR(stats.st_mode) ? AT_REMOVEDIR : 0);
        return false;
      }

      // Now move the source object to the target location.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd, toPath.cStr())) {
        default:
          // Try to put things back where they were. If this fails, though, then we have little
          // choice but to leave things broken.
          KJ_SYSCALL_HANDLE_ERRORS(renameat(fd, away.cStr(), fd, toPath.cStr())) {
            default: break;
          }

          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      }

      // OK, success. Delete the old content.
      rmrf(fd, away);
      return true;
    } else {
      // Only one of CREATE or MODIFY is specified, so we need to verify non-atomically that the
      // corresponding precondition (must-not-exist or must-exist, respectively) is held.
      if (has(mode, WriteMode::CREATE)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            break;  // doesn't exist; continue
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          return false;  // already exists; fail
        }
      } else if (has(mode, WriteMode::MODIFY)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            return false;  // doesn't exist; fail
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          // already exists; continue
        }
      } else {
        // Neither CREATE nor MODIFY.
        return false;
      }

      // Start over in create-and-modify mode.
      return tryCommitReplacement(toPath, fromDirFd, fromPath,
                                  WriteMode::CREATE | WriteMode::MODIFY,
                                  errorReason);
    }
  }